

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O1

IWindowPtr __thiscall cursespp::LayoutBase::FocusPrev(LayoutBase *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  long *plVar2;
  char cVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long *in_RSI;
  long *plVar5;
  long lVar6;
  signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *this_01;
  undefined1 auVar7 [16];
  IWindowPtr IVar8;
  undefined1 auStack_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  (**(code **)(*in_RSI + 0x1d0))(&local_38);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  plVar5 = local_38;
  if (local_38 != (long *)0x0) {
    do {
      if (plVar5 == (long *)0x0) {
        plVar2 = (long *)0x0;
      }
      else {
        plVar2 = (long *)__dynamic_cast(plVar5,&IWindow::typeinfo,&typeinfo,0);
      }
      if (plVar2 == (long *)0x0) {
LAB_0016f3c8:
        auVar7 = (**(code **)(*plVar5 + 0x128))(plVar5);
        _Var4._M_pi = auVar7._8_8_;
        plVar2 = auVar7._0_8_;
        if (plVar2 != in_RSI) {
          plVar5 = plVar2;
        }
        cVar3 = (plVar2 == in_RSI) * '\x02';
      }
      else {
        (**(code **)(*plVar2 + 0x1c8))(this,plVar2);
        cVar3 = '\x01';
        _Var4._M_pi = extraout_RDX;
        if ((this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable ==
            (_func_int **)0x0) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          goto LAB_0016f3c8;
        }
      }
    } while (cVar3 == '\0');
    if (cVar3 != '\x02') goto LAB_0016f486;
  }
  lVar6 = in_RSI[0x3f];
  *(int *)(in_RSI + 0x3f) = (int)lVar6 + -1;
  if ((int)lVar6 < 1) {
    if (*(int *)((long)in_RSI + 0x1fc) == 0) {
      iVar1 = (int)((ulong)(in_RSI[0x3d] - in_RSI[0x3c]) >> 4) + -1;
      lVar6 = 0x180;
    }
    else {
      lVar6 = 0x138;
      iVar1 = -2;
    }
    *(int *)(in_RSI + 0x3f) = iVar1;
    this_01 = (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *)
              (lVar6 + (long)in_RSI);
  }
  else {
    this_01 = (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *)0x0;
  }
  (**(code **)(*in_RSI + 0x260))(auStack_48);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (this_01 != (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *)0x0
     ) {
    sigslot::signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>::
    operator()(this_01,FocusBackward);
  }
  (**(code **)(*in_RSI + 0x1d0))(this);
  _Var4._M_pi = extraout_RDX_00;
LAB_0016f486:
  IVar8.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  IVar8.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IWindowPtr)IVar8.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IWindowPtr LayoutBase::FocusPrev() {
    sigslot::signal1<FocusDirection>* notify = nullptr;

    /* GetFocus() will return the focused Window recursively. once we know
    what it is, see if it can focus next. if it cannot, see if its parent
    can, and so on, until we reach ourselves. reaching ourself is the base
    case, and we drop through to the actual focus logic below.

    NOTE: IF YOU UPDATE THIS LOGIC, ALSO UPDATE THE CORRESPONDING CODE IN
    LayoutBase::FocusNext() */
    auto currFocus = this->GetFocus().get();
    if (currFocus) {
        do {
            auto asLayout = dynamic_cast<LayoutBase*>(currFocus);
            if (asLayout) {
                auto prevFocus = asLayout->FocusPrev();
                if (prevFocus) {
                    if (notify) {
                        (*notify)(FocusForward);
                    }
                    return prevFocus;
                }
            }

            Window* parent = (Window*) currFocus->GetParent();
            if (parent == this) { /* base case/stop condition. this should always be hit */
                break;
            }
            currFocus = parent;
        } while (true);
    }

    /*** actual focus logic starts here ***/

    --this->focused;
    if (this->focused < 0) {
        if (this->focusMode == FocusModeCircular) {
            this->focused = (int) this->focusable.size() - 1;
            notify = &FocusWrapped;
        }
        else {
            this->focused = NO_FOCUS;
            notify = &FocusTerminated;
        }
    }

    this->EnsureValidFocusFromPrev();

    if (notify) {
        (*notify)(FocusBackward);
    }

    return GetFocus();
}